

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::InsertBailOutForDebugger
          (IRBuilder *this,uint byteCodeOffset,BailOutKind kind,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  undefined4 *puVar3;
  BailOutInfo *this_00;
  BailOutInstrTemplate<IR::Instr> *instr;
  
  bVar2 = Func::IsJitInDebugMode(this->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x43,"(m_func->IsJitInDebugMode())","m_func->IsJitInDebugMode()");
    if (!bVar2) goto LAB_004c787a;
    *puVar3 = 0;
  }
  if (byteCodeOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x44,"(byteCodeOffset != Js::Constants::NoByteCodeOffset)",
                       "byteCodeOffset != Js::Constants::NoByteCodeOffset");
    if (!bVar2) {
LAB_004c787a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,this->m_func->m_alloc,0x3f1274);
  BailOutInfo::BailOutInfo(this_00,byteCodeOffset,this->m_func);
  instr = IR::BailOutInstrTemplate<IR::Instr>::New
                    (BailForDebugger,kind,this_00,this_00->bailOutFunc);
  if (insertBeforeInstr != (Instr *)0x0) {
    InsertInstr(this,&instr->super_Instr,insertBeforeInstr);
    return;
  }
  offset = IR::Instr::GetByteCodeOffset(this->m_lastInstr);
  AddInstr(this,&instr->super_Instr,offset);
  return;
}

Assistant:

void
IRBuilder::InsertBailOutForDebugger(uint byteCodeOffset, IR::BailOutKind kind, IR::Instr* insertBeforeInstr /* default nullptr */)
{
    Assert(m_func->IsJitInDebugMode());
    Assert(byteCodeOffset != Js::Constants::NoByteCodeOffset);

    BailOutInfo * bailOutInfo = JitAnew(m_func->m_alloc, BailOutInfo, byteCodeOffset, m_func);
    IR::BailOutInstr * instr = IR::BailOutInstr::New(Js::OpCode::BailForDebugger, kind, bailOutInfo, bailOutInfo->bailOutFunc);
    if (insertBeforeInstr)
    {
        InsertInstr(instr, insertBeforeInstr);
    }
    else
    {
        this->AddInstr(instr, m_lastInstr->GetByteCodeOffset());
    }
}